

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitStringTest_single_word_long_Test<char8_t>::TestBody
          (WordSplitStringTest_single_word_long_Test<char8_t> *this)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *__return_storage_ptr__
  ;
  bool bVar1;
  char *pcVar2;
  reference this_00;
  AssertHelper local_f8 [8];
  Message local_f0 [12];
  int local_e4;
  size_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0 [12];
  int local_b4;
  size_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_70;
  undefined1 local_50 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> single_word;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  WordSplitStringTest_single_word_long_Test<char8_t> *this_local;
  
  __return_storage_ptr__ =
       (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
       ((long)&single_word.field_2 + 8);
  make_delim_long<char8_t,std::__cxx11::u8string>(__return_storage_ptr__,8,'\0');
  std::__cxx11::u8string::u8string((u8string *)&local_70,__return_storage_ptr__);
  make_word<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50,
             &local_70,8);
  std::__cxx11::u8string::~u8string((u8string *)&local_70);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((container_type *)&gtest_ar.message_,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             ((long)&single_word.field_2 + 8));
  local_b0 = std::
             vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&gtest_ar.message_);
  local_b4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a8,"split_result.size()","1",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  this_00 = std::
            vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                          *)&gtest_ar.message_,0);
  local_e0 = std::__cxx11::
             basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::size
                       (this_00);
  local_e4 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d8,"split_result[0].size()","8",&local_e0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)&gtest_ar.message_);
  std::__cxx11::u8string::~u8string((u8string *)local_50);
  std::__cxx11::u8string::~u8string((u8string *)(single_word.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, single_word_long) {
	auto delim = make_delim_long<TypeParam>(8);
	std::basic_string<TypeParam> single_word = make_word<TypeParam>(delim);
	std::vector<decltype(single_word)> split_result = word_split(single_word, delim);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}